

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_store_prefix_pdu
              (rtr_socket *rtr_socket,void *pdu,uint pdu_size,void **ary,uint *ind,uint *size)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  long in_FS_OFFSET;
  char txt [15];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = *(byte *)((long)pdu + 1);
  if ((bVar1 | 2) != 6) {
    __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x348,
                  "int rtr_store_prefix_pdu(struct rtr_socket *, const void *, const unsigned int, void **, unsigned int *, unsigned int *)"
                 );
  }
  if (*size <= *ind) {
    uVar5 = *size + 100;
    *size = uVar5;
    pvVar4 = lrtr_realloc(*ary,(ulong)(uVar5 * pdu_size));
    if (pvVar4 == (void *)0x0) {
      lrtr_dbg("RTR Socket: %s");
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      iVar3 = -1;
      goto LAB_0010ae49;
    }
    *ary = pvVar4;
  }
  if (bVar1 == 6) {
    lVar6 = (ulong)*ind << 5;
LAB_0010ae38:
    memcpy((void *)(lVar6 + (long)*ary),pdu,(ulong)pdu_size);
  }
  else if (bVar1 == 4) {
    lVar6 = (ulong)*ind * 0x14;
    goto LAB_0010ae38;
  }
  *ind = *ind + 1;
  iVar3 = 0;
LAB_0010ae49:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_store_prefix_pdu(struct rtr_socket *rtr_socket, const void *pdu, const unsigned int pdu_size, void **ary,
				unsigned int *ind, unsigned int *size)
{
	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);
	if (*ind >= *size) {
		*size += TEMPORARY_PDU_STORE_INCREMENT_VALUE;
		void *tmp = lrtr_realloc(*ary, *size * pdu_size);

		if (!tmp) {
			const char txt[] = "Realloc failed";

			RTR_DBG("%s", txt);
			rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
			rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
			return RTR_ERROR;
		}
		*ary = tmp;
	}
	if (type == IPV4_PREFIX) {
		struct pdu_ipv4 *ary_ipv4 = *ary;

		memcpy(ary_ipv4 + *ind, pdu, pdu_size);
	} else if (type == IPV6_PREFIX) {
		struct pdu_ipv6 *ary_ipv6 = *ary;

		memcpy(ary_ipv6 + *ind, pdu, pdu_size);
	}
	(*ind)++;
	return RTR_SUCCESS;
}